

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  int op;
  KeyInfo *pKVar1;
  Parse *in_RSI;
  Parse *in_RDI;
  KeyInfo *pKeyInfo;
  Expr *pE;
  int nReg;
  AggInfo_func *pFunc;
  int i;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar2;
  int in_stack_ffffffffffffffd0;
  Vdbe *in_stack_ffffffffffffffd8;
  long *plVar3;
  int in_stack_ffffffffffffffe0;
  int iStart;
  Vdbe *pList;
  
  pList = in_RDI->pVdbe;
  op = in_RSI->nMem + in_RSI->nRangeReg;
  if (op != 0) {
    sqlite3VdbeAddOp3(in_stack_ffffffffffffffd8,op,in_stack_ffffffffffffffd0,
                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                     );
    plVar3 = *(long **)&in_RSI->nErr;
    for (iStart = 0; iStart < in_RSI->nMem; iStart = iStart + 1) {
      if (-1 < *(int *)((long)plVar3 + 0x14)) {
        lVar2 = *plVar3;
        if ((*(long *)(lVar2 + 0x20) == 0) || (**(int **)(lVar2 + 0x20) != 1)) {
          sqlite3ErrorMsg(in_RDI,"DISTINCT aggregates must have exactly one argument");
          *(undefined4 *)((long)plVar3 + 0x14) = 0xffffffff;
        }
        else {
          pKVar1 = sqlite3KeyInfoFromExprList
                             (in_RSI,(ExprList *)pList,iStart,in_stack_ffffffffffffffe0);
          sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,in_stack_ffffffffffffffd0),
                            (int)((ulong)lVar2 >> 0x20),(int)lVar2,(int)((ulong)pKVar1 >> 0x20),
                            (int)pKVar1,(char *)CONCAT44(in_stack_ffffffffffffffbc,0xfffffff7),
                            in_stack_ffffffffffffffe0);
        }
      }
      plVar3 = plVar3 + 3;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  int nReg = pAggInfo->nFunc + pAggInfo->nColumn;
  if( nReg==0 ) return;
#ifdef SQLITE_DEBUG
  /* Verify that all AggInfo registers are within the range specified by
  ** AggInfo.mnReg..AggInfo.mxReg */
  assert( nReg==pAggInfo->mxReg-pAggInfo->mnReg+1 );
  for(i=0; i<pAggInfo->nColumn; i++){
    assert( pAggInfo->aCol[i].iMem>=pAggInfo->mnReg
         && pAggInfo->aCol[i].iMem<=pAggInfo->mxReg );
  }
  for(i=0; i<pAggInfo->nFunc; i++){
    assert( pAggInfo->aFunc[i].iMem>=pAggInfo->mnReg
         && pAggInfo->aFunc[i].iMem<=pAggInfo->mxReg );
  }
#endif
  sqlite3VdbeAddOp3(v, OP_Null, 0, pAggInfo->mnReg, pAggInfo->mxReg);
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pExpr;
      assert( !ExprHasProperty(pE, EP_xIsSelect) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pE->x.pList,0,0);
        sqlite3VdbeAddOp4(v, OP_OpenEphemeral, pFunc->iDistinct, 0, 0,
                          (char*)pKeyInfo, P4_KEYINFO);
      }
    }
  }
}